

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

int mpz_div_qr(__mpz_struct *q,__mpz_struct *r,__mpz_struct *n,__mpz_struct *d,
              mpz_div_round_mode mode)

{
  int iVar1;
  mp_limb_t *pmVar2;
  bool bVar3;
  __mpz_struct *b;
  __mpz_struct *p_Var4;
  __mpz_struct *p_Var5;
  mp_limb_t mVar6;
  mp_ptr pmVar7;
  mp_srcptr dp;
  uint uVar8;
  ulong nn;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong dn;
  mpz_t tr;
  mpz_t tq;
  __mpz_struct local_b8;
  __mpz_struct local_a8;
  mp_ptr local_98;
  mp_limb_t *local_90;
  mpz_div_round_mode local_84;
  __mpz_struct *local_80;
  __mpz_struct *local_78;
  long local_70;
  long local_68;
  ulong local_60;
  __mpz_struct *local_58;
  gmp_div_inverse local_50;
  
  uVar9 = (ulong)d->_mp_size;
  if (uVar9 != 0) {
    uVar8 = n->_mp_size;
    local_60 = (ulong)(int)uVar8;
    if (uVar8 == 0) {
      if (q != (__mpz_struct *)0x0) {
        q->_mp_size = 0;
      }
      uVar8 = 0;
      if (r != (__mpz_struct *)0x0) {
        r->_mp_size = 0;
      }
    }
    else {
      nn = -local_60;
      if (0 < (long)local_60) {
        nn = local_60;
      }
      dn = -uVar9;
      if (0 < (long)uVar9) {
        dn = uVar9;
      }
      uVar8 = d->_mp_size ^ uVar8;
      lVar11 = nn - dn;
      if (nn < dn) {
        if ((int)uVar8 < 0 || mode != GMP_DIV_CEIL) {
          if (-1 < (int)uVar8 || mode != GMP_DIV_FLOOR) {
            if (r != (__mpz_struct *)0x0) {
              mpz_set(r,n);
            }
            if (q == (__mpz_struct *)0x0) {
              return 1;
            }
            q->_mp_size = 0;
            return 1;
          }
          if (r != (__mpz_struct *)0x0) {
            mpz_add(r,n,d);
          }
          if (q == (__mpz_struct *)0x0) {
            return 1;
          }
          q->_mp_size = -1;
        }
        else {
          if (r != (__mpz_struct *)0x0) {
            mpz_sub(r,n,d);
          }
          if (q == (__mpz_struct *)0x0) {
            return 1;
          }
          q->_mp_size = 1;
        }
        uVar8 = 1;
        if (q->_mp_alloc < 1) {
          pmVar7 = mpz_realloc(q,1);
        }
        else {
          pmVar7 = q->_mp_d;
        }
        *pmVar7 = 1;
      }
      else {
        local_b8._mp_alloc = 0;
        local_b8._mp_size = 0;
        local_b8._mp_d = &mpz_init::dummy_limb;
        local_84 = mode;
        local_80 = d;
        local_78 = q;
        local_58 = r;
        mpz_set(&local_b8,n);
        pmVar2 = local_b8._mp_d;
        lVar12 = lVar11 + 1;
        local_68 = lVar11;
        if (local_78 == (__mpz_struct *)0x0) {
          local_90 = (mp_limb_t *)0x0;
        }
        else {
          lVar11 = 0x3ffffffffffffff;
          if (lVar12 == 0) {
            lVar11 = 0;
          }
          uVar9 = lVar11 + lVar12 & 0x3ffffffffffffff;
          local_a8._mp_alloc = (int)uVar9 + 1;
          local_a8._mp_size = 0;
          local_a8._mp_d = (mp_limb_t *)(*gmp_allocate_func)(uVar9 * 8 + 8);
          local_90 = local_a8._mp_d;
        }
        if (nn < dn) goto LAB_00103948;
        dp = local_80->_mp_d;
        mpn_div_qr_invert(&local_50,dp,dn);
        if (local_50.shift == 0 || dn < 3) {
          local_98 = (mp_ptr)0x0;
        }
        else {
          local_98 = (mp_ptr)CONCAT44(local_98._4_4_,local_50.shift);
          pmVar7 = (mp_ptr)(*gmp_allocate_func)(dn * 8);
          local_70 = lVar12;
          mVar6 = mpn_lshift(pmVar7,dp,dn,(uint)local_98);
          dp = pmVar7;
          lVar12 = local_70;
          local_98 = pmVar7;
          if (mVar6 != 0) {
            __assert_fail("__cy == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                          ,0x480,"void mpn_div_qr(mp_ptr, mp_ptr, mp_size_t, mp_srcptr, mp_size_t)")
            ;
          }
        }
        mpn_div_qr_preinv(local_90,pmVar2,nn,dp,dn,&local_50);
        if (local_98 != (mp_ptr)0x0) {
          (*gmp_free_func)(local_98,0);
        }
        p_Var5 = local_58;
        p_Var4 = local_78;
        b = local_80;
        if (local_90 != (mp_ptr)0x0) {
          iVar10 = (int)lVar12 - (uint)(local_90[local_68] == 0);
          local_a8._mp_size = -iVar10;
          if (-1 < (int)uVar8) {
            local_a8._mp_size = iVar10;
          }
        }
        do {
          if (pmVar2[dn - 1] != 0) goto LAB_001037cb;
          bVar3 = 1 < (long)dn;
          dn = dn - 1;
        } while (bVar3);
        dn = 0;
LAB_001037cb:
        iVar10 = -(int)dn;
        if (-1 < (int)local_60) {
          iVar10 = (int)dn;
        }
        local_b8._mp_size = iVar10;
        if (((int)uVar8 < 0 && local_84 == GMP_DIV_FLOOR) && dn != 0) {
          if (local_78 != (__mpz_struct *)0x0) {
            mpz_sub_ui(&local_a8,&local_a8,1);
          }
          if (p_Var5 != (__mpz_struct *)0x0) {
            mpz_add(&local_b8,&local_b8,b);
          }
        }
        else if ((-1 < (int)uVar8 && local_84 == GMP_DIV_CEIL) && dn != 0) {
          if (local_78 != (__mpz_struct *)0x0) {
            mpz_add_ui(&local_a8,&local_a8,1);
          }
          if (p_Var5 != (__mpz_struct *)0x0) {
            mpz_sub(&local_b8,&local_b8,b);
          }
        }
        if (p_Var4 != (__mpz_struct *)0x0) {
          iVar10 = p_Var4->_mp_size;
          p_Var4->_mp_size = local_a8._mp_size;
          iVar1 = p_Var4->_mp_alloc;
          p_Var4->_mp_alloc = local_a8._mp_alloc;
          pmVar2 = p_Var4->_mp_d;
          p_Var4->_mp_d = local_a8._mp_d;
          local_a8._mp_alloc = iVar1;
          local_a8._mp_size = iVar10;
          local_a8._mp_d = pmVar2;
          if (iVar1 != 0) {
            (*gmp_free_func)(pmVar2,0);
          }
        }
        if (p_Var5 != (__mpz_struct *)0x0) {
          iVar10 = p_Var5->_mp_size;
          iVar1 = local_b8._mp_alloc;
          p_Var5->_mp_size = local_b8._mp_size;
          local_b8._mp_size = iVar10;
          local_b8._mp_alloc = p_Var5->_mp_alloc;
          p_Var5->_mp_alloc = iVar1;
          pmVar2 = p_Var5->_mp_d;
          p_Var5->_mp_d = local_b8._mp_d;
          local_b8._mp_d = pmVar2;
        }
        if (local_b8._mp_alloc != 0) {
          (*gmp_free_func)(local_b8._mp_d,0);
        }
        uVar8 = (uint)(dn != 0);
      }
    }
    return uVar8;
  }
  mpz_div_qr_cold_1();
LAB_00103948:
  __assert_fail("nn >= dn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vbirds[P]Bignumber/mini-gmp.c"
                ,0x47a,"void mpn_div_qr(mp_ptr, mp_ptr, mp_size_t, mp_srcptr, mp_size_t)");
}

Assistant:

static int
mpz_div_qr (mpz_t q, mpz_t r,
	    const mpz_t n, const mpz_t d, enum mpz_div_round_mode mode)
{
  mp_size_t ns, ds, nn, dn, qs;
  ns = n->_mp_size;
  ds = d->_mp_size;

  if (ds == 0)
    gmp_die("mpz_div_qr: Divide by zero.");

  if (ns == 0)
    {
      if (q)
	q->_mp_size = 0;
      if (r)
	r->_mp_size = 0;
      return 0;
    }

  nn = GMP_ABS (ns);
  dn = GMP_ABS (ds);

  qs = ds ^ ns;

  if (nn < dn)
    {
      if (mode == GMP_DIV_CEIL && qs >= 0)
	{
	  /* q = 1, r = n - d */
	  if (r)
	    mpz_sub (r, n, d);
	  if (q)
	    mpz_set_ui (q, 1);
	}
      else if (mode == GMP_DIV_FLOOR && qs < 0)
	{
	  /* q = -1, r = n + d */
	  if (r)
	    mpz_add (r, n, d);
	  if (q)
	    mpz_set_si (q, -1);
	}
      else
	{
	  /* q = 0, r = d */
	  if (r)
	    mpz_set (r, n);
	  if (q)
	    q->_mp_size = 0;
	}
      return 1;
    }
  else
    {
      mp_ptr np, qp;
      mp_size_t qn, rn;
      mpz_t tq, tr;

      mpz_init_set (tr, n);
      np = tr->_mp_d;

      qn = nn - dn + 1;

      if (q)
	{
	  mpz_init2 (tq, qn * GMP_LIMB_BITS);
	  qp = tq->_mp_d;
	}
      else
	qp = NULL;

      mpn_div_qr (qp, np, nn, d->_mp_d, dn);

      if (qp)
	{
	  qn -= (qp[qn-1] == 0);

	  tq->_mp_size = qs < 0 ? -qn : qn;
	}
      rn = mpn_normalized_size (np, dn);
      tr->_mp_size = ns < 0 ? - rn : rn;

      if (mode == GMP_DIV_FLOOR && qs < 0 && rn != 0)
	{
	  if (q)
	    mpz_sub_ui (tq, tq, 1);
	  if (r)
	    mpz_add (tr, tr, d);
	}
      else if (mode == GMP_DIV_CEIL && qs >= 0 && rn != 0)
	{
	  if (q)
	    mpz_add_ui (tq, tq, 1);
	  if (r)
	    mpz_sub (tr, tr, d);
	}

      if (q)
	{
	  mpz_swap (tq, q);
	  mpz_clear (tq);
	}
      if (r)
	mpz_swap (tr, r);

      mpz_clear (tr);

      return rn != 0;
    }
}